

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int * f5_get_stem_contributions_d5
                (vrna_fold_compound_t *fc,int j,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f5 *sc_wrapper)

{
  vrna_param_t *p;
  int *piVar1;
  int *piVar2;
  code *pcVar3;
  code *pcVar4;
  short *psVar5;
  char *pcVar6;
  vrna_sc_t *pvVar7;
  uint **ppuVar8;
  uchar uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int *piVar15;
  void *__ptr;
  int local_dc;
  int local_d8;
  undefined1 *sc_red_stem;
  undefined1 *sc_spl_stem;
  vrna_md_t *md;
  vrna_param_t *P;
  int mm5;
  int *stems;
  int *c;
  int turn;
  int *indx;
  int local_78;
  int ij;
  int i;
  uint type;
  uint **a2s;
  uint n_seq;
  uint s;
  short *sj;
  short **S5;
  short **SS;
  short *si1;
  short *S;
  char *ptype;
  sc_wrapper_f5 *sc_wrapper_local;
  default_data *hc_dat_local_local;
  vrna_callback_hc_evaluate *evaluate_local;
  int j_local;
  vrna_fold_compound_t *fc_local;
  
  piVar15 = (int *)vrna_alloc(j << 2);
  p = fc->params;
  piVar1 = fc->jindx;
  piVar2 = (fc->matrices->field_2).field_0.c;
  iVar14 = (p->model_details).min_loop_size;
  indx._4_4_ = (piVar1[j] + j) - iVar14;
  pcVar3 = (code *)sc_wrapper->decomp_stem;
  pcVar4 = (code *)sc_wrapper->red_stem;
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    psVar5 = (fc->field_23).field_0.sequence_encoding;
    pcVar6 = (fc->field_23).field_0.ptype;
    SS = (short **)(psVar5 + ((long)j - (long)iVar14));
    iVar11 = j - iVar14;
    while( true ) {
      SS = (short **)((long)SS + -2);
      local_78 = iVar11 + -1;
      if (local_78 < 2) break;
      piVar15[local_78] = 10000000;
      if ((piVar2[indx._4_4_] != 10000000) &&
         (uVar9 = (*evaluate)(1,j,iVar11 + -2,iVar11,'\x12',hc_dat_local), uVar9 != '\0')) {
        uVar10 = vrna_get_ptype(indx._4_4_,pcVar6);
        iVar11 = piVar2[indx._4_4_];
        iVar13 = vrna_E_ext_stem(uVar10,(int)*(short *)SS,-1,p);
        piVar15[local_78] = iVar11 + iVar13;
      }
      indx._4_4_ = indx._4_4_ + -1;
      iVar11 = local_78;
    }
    if (pcVar3 != (code *)0x0) {
      local_78 = j - iVar14;
      while (iVar14 = local_78, local_78 = iVar14 + -1, 1 < local_78) {
        if (piVar15[local_78] != 10000000) {
          iVar14 = (*pcVar3)(j,iVar14 + -2,iVar14,sc_wrapper);
          piVar15[local_78] = iVar14 + piVar15[local_78];
        }
      }
    }
    piVar15[1] = 10000000;
    iVar14 = piVar1[j] + 2;
    if ((piVar2[iVar14] != 10000000) &&
       (uVar9 = (*evaluate)(1,j,2,j,'\x0e',hc_dat_local), uVar9 != '\0')) {
      uVar10 = vrna_get_ptype(iVar14,pcVar6);
      iVar14 = piVar2[iVar14];
      iVar11 = vrna_E_ext_stem(uVar10,(int)psVar5[1],-1,p);
      piVar15[1] = iVar14 + iVar11;
      if (pcVar4 != (code *)0x0) {
        iVar14 = (*pcVar4)(j,2,j,sc_wrapper);
        piVar15[1] = iVar14 + piVar15[1];
      }
    }
  }
  else if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    uVar10 = (fc->field_23).field_1.n_seq;
    pcVar6 = (fc->field_23).field_0.ptype_pf_compat;
    pvVar7 = (fc->field_23).field_0.sc;
    ppuVar8 = (fc->field_23).field_1.a2s;
    __ptr = vrna_alloc(uVar10 << 1);
    for (a2s._4_4_ = 0; a2s._4_4_ < uVar10; a2s._4_4_ = a2s._4_4_ + 1) {
      *(undefined2 *)((long)__ptr + (ulong)a2s._4_4_ * 2) =
           *(undefined2 *)(*(long *)(pcVar6 + (ulong)a2s._4_4_ * 8) + (long)j * 2);
    }
    iVar11 = j - iVar14;
    while (local_78 = iVar11 + -1, 1 < local_78) {
      piVar15[local_78] = 10000000;
      if ((piVar2[indx._4_4_] != 10000000) &&
         (uVar9 = (*evaluate)(1,j,iVar11 + -2,iVar11,'\x12',hc_dat_local), uVar9 != '\0')) {
        piVar15[local_78] = piVar2[indx._4_4_];
        for (a2s._4_4_ = 0; a2s._4_4_ < uVar10; a2s._4_4_ = a2s._4_4_ + 1) {
          uVar12 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar6 + (ulong)a2s._4_4_ * 8) +
                                                    (long)iVar11 * 2),
                                     (int)*(short *)((long)__ptr + (ulong)a2s._4_4_ * 2),
                                     &p->model_details);
          if (ppuVar8[a2s._4_4_][iVar11] < 2) {
            local_d8 = -1;
          }
          else {
            local_d8 = (int)*(short *)(*(long *)(&pvVar7->type + (ulong)a2s._4_4_ * 2) +
                                      (long)iVar11 * 2);
          }
          iVar13 = vrna_E_ext_stem(uVar12,local_d8,-1,p);
          piVar15[local_78] = iVar13;
        }
      }
      indx._4_4_ = indx._4_4_ + -1;
      iVar11 = local_78;
    }
    if (pcVar3 != (code *)0x0) {
      local_78 = j - iVar14;
      while (iVar14 = local_78, local_78 = iVar14 + -1, 1 < local_78) {
        if (piVar15[local_78] != 10000000) {
          iVar14 = (*pcVar3)(j,iVar14 + -2,iVar14,sc_wrapper);
          piVar15[local_78] = iVar14 + piVar15[local_78];
        }
      }
    }
    piVar15[1] = 10000000;
    iVar14 = piVar1[j];
    if ((piVar2[iVar14 + 2] != 10000000) &&
       (uVar9 = (*evaluate)(1,j,2,j,'\x0e',hc_dat_local), uVar9 != '\0')) {
      piVar15[1] = piVar2[iVar14 + 2];
      for (a2s._4_4_ = 0; a2s._4_4_ < uVar10; a2s._4_4_ = a2s._4_4_ + 1) {
        uVar12 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar6 + (ulong)a2s._4_4_ * 8) + 4),
                                   (int)*(short *)((long)__ptr + (ulong)a2s._4_4_ * 2),
                                   &p->model_details);
        if (ppuVar8[a2s._4_4_][2] < 2) {
          local_dc = -1;
        }
        else {
          local_dc = (int)*(short *)(*(long *)(&pvVar7->type + (ulong)a2s._4_4_ * 2) + 4);
        }
        iVar14 = vrna_E_ext_stem(uVar12,local_dc,-1,p);
        piVar15[local_78] = iVar14;
      }
      if (pcVar4 != (code *)0x0) {
        iVar14 = (*pcVar4)(j,2,j,sc_wrapper);
        piVar15[1] = iVar14 + piVar15[1];
      }
    }
    free(__ptr);
  }
  return piVar15;
}

Assistant:

int *
f5_get_stem_contributions_d5(vrna_fold_compound_t       *fc,
                             int                        j,
                             vrna_callback_hc_evaluate  *evaluate,
                             struct default_data        *hc_dat_local,
                             struct sc_wrapper_f5       *sc_wrapper)
{
  char                    *ptype;
  short                   *S, *si1, **SS, **S5, *sj;
  unsigned int            s, n_seq, **a2s, type;
  int                     i, ij, *indx, turn, *c, *stems, mm5;
  vrna_param_t            *P;
  vrna_md_t               *md;

  sc_f5_split_in_ext_stem *sc_spl_stem;
  sc_f5_reduce_to_stem    *sc_red_stem;

  stems = (int *)vrna_alloc(sizeof(int) * j);

  P     = fc->params;
  md    = &(P->model_details);
  indx  = fc->jindx;
  c     = fc->matrices->c;
  turn  = md->min_loop_size;
  ij    = indx[j] + j - turn;

  sc_spl_stem = sc_wrapper->decomp_stem;
  sc_red_stem = sc_wrapper->red_stem;

  switch (fc->type) {
    case VRNA_FC_TYPE_SINGLE:
      S     = fc->sequence_encoding;
      ptype = fc->ptype;
      si1   = S + j - turn - 1;

      for (i = j - turn - 1; i > 1; i--, ij--, si1--) {
        stems[i] = INF;
        if ((c[ij] != INF) &&
            (evaluate(1, j, i - 1, i + 1, VRNA_DECOMP_EXT_EXT_STEM, hc_dat_local))) {
          type      = vrna_get_ptype(ij, ptype);
          stems[i]  = c[ij] +
                      vrna_E_ext_stem(type, *si1, -1, P);
        }
      }

      if (sc_spl_stem)
        for (i = j - turn - 1; i > 1; i--)
          if (stems[i] != INF)
            stems[i] += sc_spl_stem(j, i - 1, i + 1, sc_wrapper);

      stems[1]  = INF;
      ij        = indx[j] + 2;

      if ((c[ij] != INF) && (evaluate(1, j, 2, j, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
        type      = vrna_get_ptype(ij, ptype);
        stems[1]  = c[ij] +
                    vrna_E_ext_stem(type, S[1], -1, P);

        if (sc_red_stem)
          stems[1] += sc_red_stem(j, 2, j, sc_wrapper);
      }

      break;

    case VRNA_FC_TYPE_COMPARATIVE:
      n_seq = fc->n_seq;
      SS    = fc->S;
      S5    = fc->S5;
      a2s   = fc->a2s;

      sj = (short *)vrna_alloc(sizeof(short) * n_seq);
      for (s = 0; s < n_seq; s++)
        sj[s] = SS[s][j];

      for (i = j - turn - 1; i > 1; i--, ij--) {
        stems[i] = INF;
        if ((c[ij] != INF) &&
            (evaluate(1, j, i - 1, i + 1, VRNA_DECOMP_EXT_EXT_STEM, hc_dat_local))) {
          stems[i] = c[ij];
          for (s = 0; s < n_seq; s++) {
            type      = vrna_get_ptype_md(SS[s][i + 1], sj[s], md);
            mm5       = (a2s[s][i + 1] > 1) ? S5[s][i + 1] : -1;
            stems[i]  = vrna_E_ext_stem(type, mm5, -1, P);
          }
        }
      }

      if (sc_spl_stem)
        for (i = j - turn - 1; i > 1; i--)
          if (stems[i] != INF)
            stems[i] += sc_spl_stem(j, i - 1, i + 1, sc_wrapper);

      stems[1]  = INF;
      ij        = indx[j] + 2;

      if ((c[ij] != INF) && (evaluate(1, j, 2, j, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
        stems[1] = c[ij];
        for (s = 0; s < n_seq; s++) {
          type      = vrna_get_ptype_md(SS[s][2], sj[s], md);
          mm5       = (a2s[s][2] > 1) ? S5[s][2] : -1;
          stems[i]  = vrna_E_ext_stem(type, mm5, -1, P);
        }

        if (sc_red_stem)
          stems[1] += sc_red_stem(j, 2, j, sc_wrapper);
      }

      free(sj);

      break;
  }

  return stems;
}